

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_brep.cpp
# Opt level: O0

bool __thiscall ON_Brep::FlipReversedSurfaces(ON_Brep *this)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  ON_BrepFace *pOVar4;
  ON_BrepFace *face;
  int fi;
  bool rc;
  int face_count;
  int saved_is_solid;
  ON_Brep *this_local;
  
  iVar1 = this->m_is_solid;
  iVar2 = ON_ClassArray<ON_BrepFace>::Count((ON_ClassArray<ON_BrepFace> *)&this->m_F);
  face._7_1_ = true;
  for (face._0_4_ = 0; (int)face < iVar2; face._0_4_ = (int)face + 1) {
    pOVar4 = ON_ClassArray<ON_BrepFace>::operator[]
                       ((ON_ClassArray<ON_BrepFace> *)&this->m_F,(int)face);
    if (((pOVar4->m_bRev & 1U) != 0) &&
       (uVar3 = (*(pOVar4->super_ON_SurfaceProxy).super_ON_Surface.super_ON_Geometry.super_ON_Object
                  ._vptr_ON_Object[0x36])(), (uVar3 & 1) == 0)) {
      face._7_1_ = false;
    }
  }
  this->m_is_solid = iVar1;
  return face._7_1_;
}

Assistant:

bool
ON_Brep::FlipReversedSurfaces()
{
  // Clears all ON_BrepFace.m_bRev flags
  // by calling SwapFaceParameters() on each
  // face with a true m_bRev.
  //
  // Returns true if successful.

  // 11 April 2008 Dale Lear and Tim:
  //   face.Transpose() is clearing the m_is_solid
  //   flag but we are not changing the orientation
  //   of the brep.  This prevents having to perform
  //   the expensive step of calculating this flag
  //   again.
  int saved_is_solid = m_is_solid;

  const int face_count = m_F.Count();

  bool rc = true;
  int fi;
  for ( fi = 0; fi < face_count; fi++ ) 
  {
    ON_BrepFace& face = m_F[fi];
    if ( face.m_bRev )
    {
      if ( !face.Transpose() )
        rc = false;
    }
  }

  m_is_solid = saved_is_solid;

  return rc;
}